

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O0

void __thiscall PinholeCamera::PinholeCamera(PinholeCamera *this,Json *conf)

{
  undefined8 *in_RDI;
  vec3f *this_00;
  float fVar1;
  vec3f *v;
  vec3f vVar2;
  Json *in_stack_00000098;
  Camera *in_stack_000000a0;
  vec3f *in_stack_fffffffffffffeb8;
  vec3f *b;
  undefined8 local_128;
  float local_120;
  undefined8 local_108;
  float local_100;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_50;
  float local_48;
  
  Camera::Camera(in_stack_000000a0,in_stack_00000098);
  *in_RDI = &PTR_sampleray_001e8ce8;
  this_00 = (vec3f *)((long)in_RDI + 0x3c);
  vec3f::vec3f(this_00);
  vec3f::vec3f((vec3f *)(in_RDI + 9));
  vec3f::vec3f((vec3f *)((long)in_RDI + 0x54));
  ::operator-(this_00,in_stack_fffffffffffffeb8);
  vVar2 = normalized(this_00);
  local_48 = vVar2.z;
  local_50 = vVar2._0_8_;
  *(float *)((long)in_RDI + 0x44) = local_48;
  *(undefined8 *)((long)in_RDI + 0x3c) = local_50;
  b = (vec3f *)(in_RDI + 5);
  cross(this_00,b);
  cross(this_00,b);
  vVar2 = normalized(this_00);
  local_a8 = vVar2.z;
  local_b0 = vVar2._0_8_;
  *(float *)(in_RDI + 6) = local_a8;
  in_RDI[5] = local_b0;
  fVar1 = norm((vec3f *)0x19c15e);
  v = (vec3f *)(double)((fVar1 * (float)*(int *)((long)in_RDI + 0xc)) / (float)*(int *)(in_RDI + 1))
  ;
  tan((double)(*(float *)((long)in_RDI + 0x34) * 0.5));
  vVar2 = ::operator*(SUB84(b,0),v);
  local_c8 = vVar2.z;
  local_d0 = vVar2._0_8_;
  *(float *)(in_RDI + 10) = local_c8;
  in_RDI[9] = local_d0;
  cross(this_00,b);
  fVar1 = (float)((ulong)b >> 0x20);
  tan((double)(*(float *)((long)in_RDI + 0x34) * 0.5));
  vVar2 = ::operator*(this_00,fVar1);
  local_108 = vVar2._0_8_;
  local_100 = vVar2.z;
  *(undefined8 *)((long)in_RDI + 0x54) = local_108;
  *(float *)((long)in_RDI + 0x5c) = local_100;
  if ((*(byte *)(in_RDI + 7) & 1) != 0) {
    vVar2 = ::operator-(v);
    local_128 = vVar2._0_8_;
    local_120 = vVar2.z;
    *(undefined8 *)((long)in_RDI + 0x54) = local_128;
    *(float *)((long)in_RDI + 0x5c) = local_120;
  }
  return;
}

Assistant:

PinholeCamera(const Json& conf): Camera(conf) {
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}